

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::DescriptorPool::Tables::
AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
          (Tables *this,StringPiece *values,StringPiece *values_1)

{
  string *this_00;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  aStack_58;
  
  this_00 = (anonymous_namespace)::TableArena::Create<std::array<std::__cxx11::string,2ul>>
                      ((TableArena *)&this->arena_)->_M_elems;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(aStack_58._M_elems,values);
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(aStack_58._M_elems + 1,values_1);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator=((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             *)this_00,&aStack_58);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&aStack_58);
  return this_00;
}

Assistant:

const std::string* DescriptorPool::Tables::AllocateStringArray(In&&... values) {
  auto& array = *arena_.Create<std::array<std::string, sizeof...(In)>>();
  array = {{std::string(std::forward<In>(values))...}};
  return array.data();
}